

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * validateEmbeddingWeightsBias
                   (Result *__return_storage_ptr__,NeuralNetworkLayer *layer,WeightParams *weights,
                   WeightParams *bias)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint32_t uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  void *pvVar7;
  pointer pcVar8;
  uint uVar9;
  char cVar10;
  bool bVar11;
  undefined1 *puVar12;
  long *plVar13;
  char cVar14;
  long *plVar15;
  size_type *psVar16;
  uint64_t uVar17;
  _Alloc_hider _Var18;
  uint uVar19;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string layer_type;
  byte local_c1;
  string local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  string local_60;
  uint64_t local_40;
  uint64_t local_38;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  uVar2 = layer->_oneof_case_[0];
  if (uVar2 == 0x96) {
    if (uVar2 == 0x96) {
      puVar12 = *(undefined1 **)&layer->layer_;
    }
    else {
      puVar12 = CoreML::Specification::_EmbeddingLayerParams_default_instance_;
    }
    local_38 = ((InnerProductLayerParams *)puVar12)->inputchannels_;
    uVar17 = ((InnerProductLayerParams *)puVar12)->outputchannels_;
    local_c1 = ((InnerProductLayerParams *)puVar12)->hasbias_;
    std::__cxx11::string::_M_replace((ulong)&local_60,0,(char *)0x0,0x3d85ef);
  }
  else {
    if (uVar2 != 0x410) {
      CoreML::Result::Result(__return_storage_ptr__);
      goto LAB_00363f59;
    }
    if (uVar2 != 0x410) {
      puVar12 = CoreML::Specification::_EmbeddingNDLayerParams_default_instance_;
    }
    else {
      puVar12 = *(undefined1 **)&layer->layer_;
    }
    local_38 = ((InnerProductLayerParams *)puVar12)->inputchannels_;
    uVar17 = ((InnerProductLayerParams *)puVar12)->outputchannels_;
    local_c1 = ((InnerProductLayerParams *)puVar12)->hasbias_;
    std::__cxx11::string::_M_replace((ulong)&local_60,0,(char *)0x0,0x3e3732);
  }
  iVar3 = (weights->floatvalue_).current_size_;
  lVar4 = *(long *)(((ulong)(weights->float16value_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  uVar19 = (0 < iVar3) + 1;
  if (lVar4 == 0) {
    uVar19 = (uint)(0 < iVar3);
  }
  lVar5 = *(long *)(((ulong)(weights->rawvalue_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  lVar6 = *(long *)(((ulong)(weights->int8rawvalue_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  uVar9 = (uint)(lVar6 == 0);
  uVar19 = (uVar19 - (lVar5 == 0)) + 2;
  cVar10 = '\x04';
  cVar14 = '\x04';
  if (uVar19 - uVar9 < 2) {
    cVar14 = '\x05';
    if (uVar19 != uVar9) {
      cVar14 = iVar3 < 1;
    }
    if (((((lVar4 == 0) && (uVar19 != uVar9)) && (iVar3 < 1)) &&
        (((lVar5 == 0 ||
          (weights == (WeightParams *)CoreML::Specification::_WeightParams_default_instance_)) ||
         (cVar14 = '\x02', weights->quantization_ == (QuantizationParams *)0x0)))) &&
       (((lVar6 == 0 ||
         (weights == (WeightParams *)CoreML::Specification::_WeightParams_default_instance_)) ||
        (cVar14 = '\x03', weights->quantization_ == (QuantizationParams *)0x0)))) {
      cVar14 = '\x05';
    }
  }
  iVar3 = (bias->floatvalue_).current_size_;
  lVar4 = *(long *)(((ulong)(bias->float16value_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  uVar19 = (0 < iVar3) + 1;
  if (lVar4 == 0) {
    uVar19 = (uint)(0 < iVar3);
  }
  lVar5 = *(long *)(((ulong)(bias->rawvalue_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  lVar6 = *(long *)(((ulong)(bias->int8rawvalue_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  uVar9 = (uint)(lVar6 == 0);
  uVar19 = (uVar19 - (lVar5 == 0)) + 2;
  if (uVar19 - uVar9 < 2) {
    cVar10 = '\x05';
    if (uVar19 != uVar9) {
      cVar10 = iVar3 < 1;
    }
    if ((((lVar4 == 0) && (uVar19 != uVar9)) && (iVar3 < 1)) &&
       ((((lVar5 == 0 ||
          (bias == (WeightParams *)CoreML::Specification::_WeightParams_default_instance_)) ||
         (cVar10 = '\x02', bias->quantization_ == (QuantizationParams *)0x0)) &&
        (((lVar6 == 0 ||
          (bias == (WeightParams *)CoreML::Specification::_WeightParams_default_instance_)) ||
         (cVar10 = '\x03', bias->quantization_ == (QuantizationParams *)0x0)))))) {
      cVar10 = '\x05';
    }
  }
  if ((cVar14 == '\x04') || ((cVar10 == '\x04' & local_c1) != 0)) {
    local_a0[0] = &local_90;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,local_60._M_dataplus._M_p,
               local_60._M_dataplus._M_p + local_60._M_string_length);
    std::__cxx11::string::append((char *)local_a0);
    plVar13 = (long *)std::__cxx11::string::_M_append
                                ((char *)local_a0,
                                 *(ulong *)((ulong)(layer->name_).tagged_ptr_.ptr_ &
                                           0xfffffffffffffffe));
    plVar15 = plVar13 + 2;
    if ((long *)*plVar13 == plVar15) {
      local_70 = *plVar15;
      lStack_68 = plVar13[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar15;
      local_80 = (long *)*plVar13;
    }
    local_78 = plVar13[1];
    *plVar13 = (long)plVar15;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_80);
    psVar16 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_c0.field_2._M_allocated_capacity = *psVar16;
      local_c0.field_2._8_8_ = plVar13[3];
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    }
    else {
      local_c0.field_2._M_allocated_capacity = *psVar16;
      local_c0._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_c0._M_string_length = plVar13[1];
    *plVar13 = (long)psVar16;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if (local_a0[0] != &local_90) {
      operator_delete(local_a0[0],local_90._M_allocated_capacity + 1);
    }
    CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_c0);
    local_90._M_allocated_capacity = local_c0.field_2._M_allocated_capacity;
    _Var18._M_p = local_c0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p == &local_c0.field_2) goto LAB_00363f59;
  }
  else {
    if ((local_c1 == 0) ||
       (((cVar14 != '\x01' || (cVar10 != '\0')) && ((cVar14 != '\0' || (cVar10 != '\x01')))))) {
      pvVar7 = (layer->name_).tagged_ptr_.ptr_;
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      local_40 = uVar17;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"weight","");
      CoreML::validateGeneralWeightParams
                (__return_storage_ptr__,weights,local_38 * local_40,local_40,&local_60,
                 (string *)((ulong)pvVar7 & 0xfffffffffffffffe),&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      bVar11 = CoreML::Result::good(__return_storage_ptr__);
      if (bVar11) {
        pcVar8 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        paVar1 = &(__return_storage_ptr__->m_message).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar8 != paVar1) {
          operator_delete(pcVar8,paVar1->_M_allocated_capacity + 1);
        }
        if (local_c1 != 0) {
          pvVar7 = (layer->name_).tagged_ptr_.ptr_;
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"bias","");
          CoreML::validateGeneralWeightParams
                    (__return_storage_ptr__,bias,local_40,1,&local_60,
                     (string *)((ulong)pvVar7 & 0xfffffffffffffffe),&local_c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          bVar11 = CoreML::Result::good(__return_storage_ptr__);
          if (!bVar11) goto LAB_00363f59;
          pcVar8 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar8 != paVar1) {
            operator_delete(pcVar8,paVar1->_M_allocated_capacity + 1);
          }
        }
        CoreML::Result::Result(__return_storage_ptr__);
      }
      goto LAB_00363f59;
    }
    local_a0[0] = &local_90;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,local_60._M_dataplus._M_p,
               local_60._M_dataplus._M_p + local_60._M_string_length);
    std::__cxx11::string::append((char *)local_a0);
    plVar13 = (long *)std::__cxx11::string::_M_append
                                ((char *)local_a0,
                                 *(ulong *)((ulong)(layer->name_).tagged_ptr_.ptr_ &
                                           0xfffffffffffffffe));
    plVar15 = plVar13 + 2;
    if ((long *)*plVar13 == plVar15) {
      local_70 = *plVar15;
      lStack_68 = plVar13[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar15;
      local_80 = (long *)*plVar13;
    }
    local_78 = plVar13[1];
    *plVar13 = (long)plVar15;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_80);
    psVar16 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_c0.field_2._M_allocated_capacity = *psVar16;
      local_c0.field_2._8_8_ = plVar13[3];
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    }
    else {
      local_c0.field_2._M_allocated_capacity = *psVar16;
      local_c0._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_c0._M_string_length = plVar13[1];
    *plVar13 = (long)psVar16;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    _Var18._M_p = (pointer)local_a0[0];
    if (local_a0[0] == &local_90) goto LAB_00363f59;
  }
  operator_delete(_Var18._M_p,local_90._M_allocated_capacity + 1);
LAB_00363f59:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static Result validateEmbeddingWeightsBias(const Specification::NeuralNetworkLayer& layer,
                                              const Specification::WeightParams& weights,
                                              const Specification::WeightParams& bias) {
    bool has_bias;
    uint64_t input_dim;
    uint64_t output_channels;
    std::string layer_type;

    switch(layer.layer_case()) {
        case Specification::NeuralNetworkLayer::LayerCase::kEmbedding: {
            const auto& params = layer.embedding();
            input_dim = params.inputdim();
            output_channels = params.outputchannels();
            has_bias = params.hasbias();
            layer_type = "Embedding";
            break;
        }
        case Specification::NeuralNetworkLayer::LayerCase::kEmbeddingND: {
            const auto& params = layer.embeddingnd();
            input_dim = params.vocabsize();
            output_channels = params.embeddingsize();
            has_bias = params.hasbias();
            layer_type = "EmbeddingND";
            break;
        }
        default:
            return Result();
    }

    WeightParamType weightsValueType, biasValueType;
    weightsValueType = valueType(weights);
    biasValueType = valueType(bias);

    // Only float32 or float16 parameters can be populated at any time
    if ((weightsValueType == UNSPECIFIED) || (has_bias && biasValueType == UNSPECIFIED)){
        std::string err = layer_type + " '" + layer.name() + "' has invalid weights/bias fields. Field value types should match and should either be half or full precision.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (has_bias){
        if ((weightsValueType == CoreML::FLOAT16 && biasValueType == CoreML::FLOAT32) ||
            (weightsValueType == CoreML::FLOAT32 && biasValueType == CoreML::FLOAT16)){
            return Result(ResultType::INVALID_MODEL_PARAMETERS, layer_type + " layer '" + layer.name() +
                          "has unmatched precisions of weights/bias They should either be half or full precision.");
        }
    }
    // Validate weight and bias sizes
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weights, input_dim * output_channels, output_channels,
                                                                  layer_type, layer.name(), "weight"));
    if (has_bias){
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(bias, output_channels, 1,
                                                                      layer_type, layer.name(), "bias"));
    }

    return Result();
}